

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

void __thiscall
HashCallback<unsigned_long>::operator()(HashCallback<unsigned_long> *this,void *key,int len)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  unsigned_long in_RAX;
  unsigned_long h;
  unsigned_long local_28;
  
  this_00 = this->m_hashes;
  local_28 = in_RAX;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (this_00,((long)(this_00->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  (*this->m_pfHash)(key,len,0,&local_28);
  (this->m_hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish[-1] = local_28;
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    size_t newsize = m_hashes.size() + 1;

    m_hashes.resize(newsize);

    hashtype h;
    m_pfHash(key, len, 0, &h);
    m_hashes.back() = h;
  }